

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

string * __thiscall
polyscope::prettyPrintCount_abi_cxx11_(string *__return_storage_ptr__,polyscope *this,size_t count)

{
  unsigned_long __val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  char cVar4;
  long *plVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  size_type *psVar9;
  polyscope *ppVar10;
  ulong uVar11;
  unsigned_long uVar12;
  int iVar13;
  char cVar14;
  long lVar15;
  undefined1 in_ZMM0 [64];
  undefined1 auVar16 [64];
  double __x;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string postfix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  postFixes;
  char buf [50];
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  char *local_f8;
  uint local_f0;
  char local_e8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [24];
  undefined1 extraout_var [56];
  
  cVar14 = '\x01';
  if (this != (polyscope *)0x0) {
    auVar3 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,this);
    __x = auVar3._0_8_;
    auVar16._0_8_ = log10(__x);
    auVar16._8_56_ = extraout_var;
    auVar3 = vroundsd_avx(auVar16._0_16_,auVar16._0_16_,9);
    iVar13 = (int)(auVar3._0_8_ + 1.0);
    if (4 < iVar13) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"K","");
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"M","");
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"B","");
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"T","");
      __l._M_len = 5;
      __l._M_array = &local_d8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_110,__l,(allocator_type *)&local_130);
      lVar15 = 0;
      do {
        if (local_48 + lVar15 != *(undefined1 **)((long)local_58 + lVar15)) {
          operator_delete(*(undefined1 **)((long)local_58 + lVar15));
        }
        lVar15 = lVar15 + -0x20;
      } while (lVar15 != -0xa0);
      iVar13 = iVar13 + 3;
      uVar11 = 0;
      uVar8 = 0xfffffffffffffffd;
      do {
        uVar7 = uVar8;
        __x = __x / 1000.0;
        uVar11 = uVar11 + 1;
        uVar8 = uVar7 + 3;
        iVar13 = iVar13 + -3;
      } while (6 < iVar13);
      local_128 = 0;
      local_120[0] = 0;
      local_130 = local_120;
      if (uVar11 < (ulong)((long)local_110.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_110.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5)) {
        std::__cxx11::string::_M_assign((string *)&local_130);
      }
      else {
        __val = uVar7 + 6;
        cVar14 = '\x01';
        if (6 < uVar8) {
          uVar12 = __val;
          cVar4 = '\x04';
          do {
            cVar14 = cVar4;
            if (uVar12 < 100) {
              cVar14 = cVar14 + -2;
              goto LAB_001f6fbf;
            }
            if (uVar12 < 1000) {
              cVar14 = cVar14 + -1;
              goto LAB_001f6fbf;
            }
            if (uVar12 < 10000) goto LAB_001f6fbf;
            bVar2 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar4 = cVar14 + '\x04';
          } while (bVar2);
          cVar14 = cVar14 + '\x01';
        }
LAB_001f6fbf:
        local_f8 = local_e8;
        std::__cxx11::string::_M_construct((ulong)&local_f8,cVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_f8,local_f0,__val);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x3371d3);
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_d8.field_2._M_allocated_capacity = *psVar9;
          local_d8.field_2._8_8_ = plVar5[3];
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = *psVar9;
          local_d8._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_d8._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_130,(string *)&local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if (local_f8 != local_e8) {
          operator_delete(local_f8);
        }
      }
      paVar1 = &__return_storage_ptr__->field_2;
      if (iVar13 == 5) {
        snprintf((char *)&local_d8,0x32,"%2.1f%s",__x,local_130);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
        sVar6 = strlen((char *)&local_d8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,&local_d8,
                   (long)&local_d8._M_dataplus._M_p + sVar6);
      }
      else if (iVar13 == 4) {
        snprintf((char *)&local_d8,0x32,"%2.2f%s",__x,local_130);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
        sVar6 = strlen((char *)&local_d8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,&local_d8,
                   (long)&local_d8._M_dataplus._M_p + sVar6);
      }
      else {
        snprintf((char *)&local_d8,0x32,"%2.0f%s",__x,local_130);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
        sVar6 = strlen((char *)&local_d8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,&local_d8,
                   (long)&local_d8._M_dataplus._M_p + sVar6);
      }
      if (local_130 != local_120) {
        operator_delete(local_130);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_110);
      return __return_storage_ptr__;
    }
    if ((polyscope *)&DAT_00000009 < this) {
      ppVar10 = this;
      cVar4 = '\x04';
      do {
        cVar14 = cVar4;
        if (ppVar10 < (polyscope *)0x64) {
          cVar14 = cVar14 + -2;
          goto LAB_001f6f91;
        }
        if (ppVar10 < (polyscope *)0x3e8) {
          cVar14 = cVar14 + -1;
          goto LAB_001f6f91;
        }
        if (ppVar10 < (polyscope *)0x2710) goto LAB_001f6f91;
        bVar2 = (polyscope *)0x1869f < ppVar10;
        ppVar10 = (polyscope *)((ulong)ppVar10 / 10000);
        cVar4 = cVar14 + '\x04';
      } while (bVar2);
      cVar14 = cVar14 + '\x01';
    }
  }
LAB_001f6f91:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar14);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,(unsigned_long)this);
  return __return_storage_ptr__;
}

Assistant:

std::string prettyPrintCount(size_t count) {

  int nDigits = 1;
  if (count > 0) {
    nDigits = 1 + std::floor(std::log10(count));
  }

  // Print small values exactly
  if (nDigits <= 4) {
    return std::to_string(count);
  }

  std::vector<std::string> postFixes = {"", "K", "M", "B", "T"};
  size_t iPostfix = 0;
  size_t iPow = 0;
  double countD = count;

  while (nDigits > 3) {
    count /= 1000;
    countD /= 1000;
    iPostfix++;
    iPow += 3;
    nDigits -= 3;
  }

  // Get a postfix, either as a predefined character or scientific notation
  std::string postfix;
  if (iPostfix < postFixes.size()) {
    postfix = postFixes[iPostfix];
  } else {
    postfix = "*10^" + std::to_string(iPow);
  }

  // Build the actual string
  char buf[50];
  if (nDigits == 1) {
    snprintf(buf, 50, "%2.2f%s", countD, postfix.c_str());
    return std::string(buf);
  } else if (nDigits == 2) {
    snprintf(buf, 50, "%2.1f%s", countD, postfix.c_str());
    return std::string(buf);
  } else /*(nDigits == 3) */ {
    snprintf(buf, 50, "%2.0f%s", countD, postfix.c_str());
    return std::string(buf);
  }
}